

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osc-spec.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int in_stack_0000000c;
  int sz;
  size_t in_stack_00000018;
  size_t in_stack_00000020;
  char *in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_ffffffffffffffe8;
  char *testcase;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  rtosc_message((char *)0x407b800000000000,0x1070a0,(char *)0x100,"/oscillator/4/frequency","f");
  assert_int_eq(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,0);
  assert_hex_eq(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,_sz,
                in_stack_0000000c);
  testcase = "hello";
  rtosc_message((char *)0x3ff3be76c0000000,0x4016b645a0000000,buffer,(char *)0x100,"/foo","iisff",
                1000,0xffffffff);
  assert_int_eq(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,testcase,0);
  assert_hex_eq(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,_sz,
                in_stack_0000000c);
  iVar1 = test_summary();
  return iVar1;
}

Assistant:

int main()
{
    int sz = rtosc_message(buffer, 256, "/oscillator/4/frequency", "f", 440.0f);
    assert_int_eq(sizeof(message_one), sz,
            "Creating Single Argument Message From OSC Spec", __LINE__);
    assert_hex_eq((char*)message_one, buffer, sizeof(message_one), sz,
            "Validating Binary Representation of Message 1", __LINE__);

    sz = rtosc_message(buffer, 256, "/foo", "iisff",
                1000, -1, "hello", 1.234f, 5.678f);
    assert_int_eq(sizeof(message_two), sz,
            "Creating Multi Argument Message From OSC Spec", __LINE__);
    assert_hex_eq((char*)message_two, buffer, sizeof(message_two), sz,
            "Validating Binary Representation of Message 2", __LINE__);
    return test_summary();
}